

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::Int(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
      *this,int i)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  uint32_t u;
  char *pcVar3;
  char *pcVar4;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  pcVar4 = this_00->stackTop_;
  if (this_00->stackEnd_ <= pcVar4 + 0xb) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0xb);
    pcVar4 = this_00->stackTop_;
  }
  this_00->stackTop_ = pcVar4 + 0xb;
  pcVar3 = pcVar4;
  if (i < 0) {
    *pcVar4 = '-';
    i = -i;
    pcVar3 = pcVar4 + 1;
  }
  pcVar2 = internal::u32toa(i,pcVar3);
  pGVar1 = this->os_;
  pcVar3 = (pGVar1->stack_).stackTop_;
  if ((ulong)((long)pcVar3 - (long)(pGVar1->stack_).stack_) < ((long)pcVar4 - (long)pcVar2) + 0xbU)
  {
    __assert_fail("GetSize() >= count * sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/internal/stack.h"
                  ,0x71,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                 );
  }
  (pGVar1->stack_).stackTop_ = pcVar3 + (-0xb - ((long)pcVar4 - (long)pcVar2));
  return true;
}

Assistant:

bool Int(int i)             { Prefix(kNumberType); return WriteInt(i); }